

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::CategoricalMapping::ByteSizeLong(CategoricalMapping *this)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  
  if (this->_oneof_case_[0] == 2) {
    sVar3 = Int64ToStringMap::ByteSizeLong((this->MappingType_).int64tostringmap_);
  }
  else {
    if (this->_oneof_case_[0] != 1) {
      sVar3 = 0;
      goto LAB_002bc418;
    }
    sVar3 = StringToInt64Map::ByteSizeLong((this->MappingType_).stringtoint64map_);
  }
  uVar4 = (uint)sVar3 | 1;
  iVar2 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  sVar3 = sVar3 + (iVar2 * 9 + 0x49U >> 6) + 1;
LAB_002bc418:
  if (this->_oneof_case_[1] == 0x66) {
    uVar5 = (this->ValueOnUnknown_).int64value_ | 1;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = sVar3 + ((int)lVar1 * 9 + 0x49U >> 6) + 2;
  }
  else if (this->_oneof_case_[1] == 0x65) {
    lVar1 = *(long *)((this->ValueOnUnknown_).int64value_ + 8);
    uVar4 = (uint)lVar1 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar3 = sVar3 + lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t CategoricalMapping::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CategoricalMapping)
  size_t total_size = 0;

  switch (MappingType_case()) {
    // .CoreML.Specification.StringToInt64Map stringToInt64Map = 1;
    case kStringToInt64Map: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *MappingType_.stringtoint64map_);
      break;
    }
    // .CoreML.Specification.Int64ToStringMap int64ToStringMap = 2;
    case kInt64ToStringMap: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *MappingType_.int64tostringmap_);
      break;
    }
    case MAPPINGTYPE_NOT_SET: {
      break;
    }
  }
  switch (ValueOnUnknown_case()) {
    // string strValue = 101;
    case kStrValue: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->strvalue());
      break;
    }
    // int64 int64Value = 102;
    case kInt64Value: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->int64value());
      break;
    }
    case VALUEONUNKNOWN_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}